

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walIndexAppend(Wal *pWal,u32 iFrame,u32 iPage)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  WalHashLoc sLoc;
  WalHashLoc local_48;
  
  iVar2 = walHashGet(pWal,(int)((ulong)(iFrame + 0x1000) + 0xffffffff021 >> 0xc),&local_48);
  if (iVar2 == 0) {
    iVar2 = iFrame - local_48.iZero;
    if (iVar2 == 1) {
      memset(local_48.aPgno,0,(long)(((int)local_48.aHash - (int)local_48.aPgno) + 0x4000));
    }
    if (local_48.aPgno[(long)iVar2 + -1] != 0) {
      walCleanupHash(pWal);
    }
    lVar1 = CONCAT44(local_48.aHash._4_4_,(int)local_48.aHash);
    uVar3 = (ulong)(iPage * 0x17f & 0x1fff);
    if (*(short *)(lVar1 + uVar3 * 2) != 0) {
      iVar4 = ~iFrame + local_48.iZero;
      do {
        iVar4 = iVar4 + 1;
        if (iVar4 == 0) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf565,
                      "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
          return 0xb;
        }
        uVar3 = (ulong)((int)uVar3 + 1U & 0x1fff);
      } while (*(short *)(lVar1 + uVar3 * 2) != 0);
    }
    local_48.aPgno[(long)iVar2 + -1] = iPage;
    *(short *)(lVar1 + uVar3 * 2) = (short)iVar2;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int walIndexAppend(Wal *pWal, u32 iFrame, u32 iPage){
  int rc;                         /* Return code */
  WalHashLoc sLoc;                /* Wal-index hash table location */

  rc = walHashGet(pWal, walFramePage(iFrame), &sLoc);

  /* Assuming the wal-index file was successfully mapped, populate the
  ** page number array and hash table entry.
  */
  if( rc==SQLITE_OK ){
    int iKey;                     /* Hash table key */
    int idx;                      /* Value to write to hash-table slot */
    int nCollide;                 /* Number of hash collisions */

    idx = iFrame - sLoc.iZero;
    assert( idx <= HASHTABLE_NSLOT/2 + 1 );

    /* If this is the first entry to be added to this hash-table, zero the
    ** entire hash table and aPgno[] array before proceeding.
    */
    if( idx==1 ){
      int nByte = (int)((u8*)&sLoc.aHash[HASHTABLE_NSLOT] - (u8*)sLoc.aPgno);
      assert( nByte>=0 );
      memset((void*)sLoc.aPgno, 0, nByte);
    }

    /* If the entry in aPgno[] is already set, then the previous writer
    ** must have exited unexpectedly in the middle of a transaction (after
    ** writing one or more dirty pages to the WAL to free up memory).
    ** Remove the remnants of that writers uncommitted transaction from
    ** the hash-table before writing any new entries.
    */
    if( sLoc.aPgno[idx-1] ){
      walCleanupHash(pWal);
      assert( !sLoc.aPgno[idx-1] );
    }

    /* Write the aPgno[] array entry and the hash-table slot. */
    nCollide = idx;
    for(iKey=walHash(iPage); sLoc.aHash[iKey]; iKey=walNextHash(iKey)){
      if( (nCollide--)==0 ) return SQLITE_CORRUPT_BKPT;
    }
    sLoc.aPgno[idx-1] = iPage;
    AtomicStore(&sLoc.aHash[iKey], (ht_slot)idx);

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
    /* Verify that the number of entries in the hash table exactly equals
    ** the number of entries in the mapping region.
    */
    {
      int i;           /* Loop counter */
      int nEntry = 0;  /* Number of entries in the hash table */
      for(i=0; i<HASHTABLE_NSLOT; i++){ if( sLoc.aHash[i] ) nEntry++; }
      assert( nEntry==idx );
    }

    /* Verify that the every entry in the mapping region is reachable
    ** via the hash table.  This turns out to be a really, really expensive
    ** thing to check, so only do this occasionally - not on every
    ** iteration.
    */
    if( (idx&0x3ff)==0 ){
      int i;           /* Loop counter */
      for(i=0; i<idx; i++){
        for(iKey=walHash(sLoc.aPgno[i]);
            sLoc.aHash[iKey];
            iKey=walNextHash(iKey)){
          if( sLoc.aHash[iKey]==i+1 ) break;
        }
        assert( sLoc.aHash[iKey]==i+1 );
      }
    }
#endif /* SQLITE_ENABLE_EXPENSIVE_ASSERT */
  }

  return rc;
}